

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzellipse3d.cpp
# Opt level: O2

void __thiscall
pzgeom::TPZEllipse3D::GradX<Fad<double>>
          (TPZEllipse3D *this,TPZFMatrix<double> *cornerco,TPZVec<Fad<double>_> *par,
          TPZFMatrix<Fad<double>_> *gradx)

{
  Fad<double> *pFVar1;
  int j;
  long col;
  int i_1;
  int i;
  long lVar2;
  Fad<double> *local_398;
  Fad<double> *local_390;
  double dStack_388;
  TPZFMatrix<Fad<double>_> *local_380;
  Fad<double> *local_378;
  undefined8 uStack_370;
  Fad<double> dangledqsi;
  Fad<double> angle;
  TPZFMatrix<Fad<double>_> axloc;
  Fad<double> local_290;
  Fad<double> local_270;
  TPZFNMatrix<3,_Fad<double>_> dxcoglob;
  TPZFNMatrix<3,_Fad<double>_> dxcoloc;
  
  dxcoloc.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow =
       (int64_t)this->fAngleIni;
  dxcoglob.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow =
       (int64_t)(this->fAngleFinal -
                (double)dxcoloc.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
                        super_TPZBaseMatrix.fRow);
  dangledqsi.val_ =
       (double)dxcoglob.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
               super_TPZBaseMatrix.fRow * 0.5;
  dangledqsi.dx_.num_elts = 0;
  dangledqsi.dx_.ptr_to_data = (double *)0x0;
  dangledqsi.defaultVal = 0.0;
  local_398 = par->fStore;
  axloc.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&local_398;
  local_390 = (Fad<double> *)0x3ff0000000000000;
  dStack_388 = 0.0;
  dxcoglob.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&axloc;
  dxcoloc.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix._24_8_ =
       &dxcoglob;
  dxcoglob.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol = 0
  ;
  axloc.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow = 0x4000000000000000;
  axloc.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol = 0;
  dxcoloc.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol = 0;
  Fad<double>::
  Fad<FadBinaryAdd<FadCst<double>,FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,FadCst<double>>>,FadCst<double>>>,FadCst<double>>>>>
            (&angle,(FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>_>_>
                     *)&dxcoloc);
  dxcoglob.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  dxcoglob.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow =
       dxcoglob.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
       fRow & 0xffffffff00000000;
  dxcoglob.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol = 0
  ;
  dxcoglob.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  fDecomposed = '\0';
  dxcoglob.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  fDefPositive = '\0';
  dxcoglob.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix._26_6_ =
       0;
  TPZFNMatrix<3,_Fad<double>_>::TPZFNMatrix(&dxcoloc,3,1,(Fad<double> *)&dxcoglob);
  Fad<double>::~Fad((Fad<double> *)&dxcoglob);
  axloc.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  axloc.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow =
       axloc.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow & 0xffffffff00000000;
  axloc.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol = 0;
  axloc.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  axloc.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  axloc.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix._26_6_ = 0;
  TPZFNMatrix<3,_Fad<double>_>::TPZFNMatrix(&dxcoglob,3,1,(Fad<double> *)&axloc);
  Fad<double>::~Fad((Fad<double> *)&axloc);
  local_378 = (Fad<double> *)this->fsAxeX;
  uStack_370 = 0;
  sin<double>((FadExpr<FadFuncSin<Fad<double>_>_> *)&axloc,&angle);
  local_390 = (Fad<double> *)((ulong)local_378 ^ 0x8000000000000000);
  dStack_388 = 0.0;
  local_380 = &axloc;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(&dxcoloc.super_TPZFMatrix<Fad<double>_>,0,0);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_> *)
                    &local_398);
  Fad<double>::~Fad((Fad<double> *)&axloc.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow);
  local_378 = (Fad<double> *)this->fsAxeY;
  cos<double>((FadExpr<FadFuncCos<Fad<double>_>_> *)&axloc,&angle);
  local_390 = local_378;
  dStack_388 = 0.0;
  local_380 = &axloc;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(&dxcoloc.super_TPZFMatrix<Fad<double>_>,1,0);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_> *)
                    &local_398);
  Fad<double>::~Fad((Fad<double> *)&axloc.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow);
  TPZFMatrix<Fad<double>_>::TPZFMatrix(&axloc,3,3);
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    for (col = 0; col != 3; col = col + 1) {
      local_398 = (Fad<double> *)
                  (this->fAxes).super_TPZFMatrix<double>.fElem
                  [(this->fAxes).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                   super_TPZBaseMatrix.fRow * col + lVar2];
      pFVar1 = TPZFMatrix<Fad<double>_>::operator()(&axloc,lVar2,col);
      Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)&local_398);
    }
  }
  local_270.val_ = 1.0;
  local_270.dx_.num_elts = 0;
  local_270.dx_.ptr_to_data = (double *)0x0;
  local_270.defaultVal = 0.0;
  local_290.val_ = 0.0;
  local_290.dx_.num_elts = 0;
  local_290.dx_.ptr_to_data = (double *)0x0;
  local_290.defaultVal = 0.0;
  TPZFMatrix<Fad<double>_>::MultAdd
            (&axloc,&dxcoloc.super_TPZFMatrix<Fad<double>_>,&dxcoloc.super_TPZFMatrix<Fad<double>_>,
             &dxcoglob.super_TPZFMatrix<Fad<double>_>,&local_270,&local_290,1);
  Fad<double>::~Fad(&local_290);
  Fad<double>::~Fad(&local_270);
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    local_390 = TPZFMatrix<Fad<double>_>::operator()
                          (&dxcoglob.super_TPZFMatrix<Fad<double>_>,lVar2,0);
    local_398 = &dangledqsi;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(gradx,lVar2,0);
    Fad<double>::operator=(pFVar1,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&local_398);
  }
  TPZFMatrix<Fad<double>_>::~TPZFMatrix(&axloc);
  TPZFNMatrix<3,_Fad<double>_>::~TPZFNMatrix(&dxcoglob);
  TPZFNMatrix<3,_Fad<double>_>::~TPZFNMatrix(&dxcoloc);
  Fad<double>::~Fad(&angle);
  Fad<double>::~Fad(&dangledqsi);
  return;
}

Assistant:

void TPZEllipse3D::GradX(TPZFMatrix<REAL> &cornerco, TPZVec<T> &par, TPZFMatrix<T> &gradx) const
{
    REAL delangle = fAngleFinal - fAngleIni;
    T dangledqsi = 1./2.*delangle;
    T angle = fAngleIni + (par[0]+1.)/2.*delangle;
    TPZFNMatrix<3,T> dxcoloc(3,1,0.),dxcoglob(3,1,0.);
    dxcoloc(0,0) = -fsAxeX*sin(angle);
    dxcoloc(1,0) = fsAxeY*cos(angle);
    int transp = 1;
    TPZFMatrix<T> axloc(3,3);
    for (int i=0; i<3; i++) {
        for (int j=0; j<3; j++) {
            axloc(i,j) = fAxes.GetVal(i,j);
        }
    }
    axloc.MultAdd(dxcoloc, dxcoloc, dxcoglob,1.,0.,transp);
    for (int i=0; i<3; i++) {
        gradx(i,0) = dangledqsi*dxcoglob(i,0);
    }

}